

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O3

MPP_RET calc_next_i_ratio(RcModelV2Ctx *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar2 = (ctx->usr_cfg).max_i_bit_prop;
  iVar3 = (ctx->usr_cfg).igop;
  iVar1 = ctx->pre_i_qp;
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter %p\n","calc_next_i_ratio");
  }
  lVar4 = ctx->gop_total_bits;
  if (1 < iVar3) {
    lVar5 = (long)iVar2 * 0x10;
    lVar4 = (lVar4 * lVar5) / (long)((int)lVar5 + iVar3 * 0x10 + -0x10);
  }
  iVar3 = (int)lVar4;
  iVar2 = ctx->pre_real_bits - iVar3;
  if (iVar2 != 0 && iVar3 <= ctx->pre_real_bits || ctx->next_i_ratio != 0) {
    iVar3 = (iVar2 * 0x100) / iVar3;
    iVar2 = 0x100;
    if (iVar3 < 0x100) {
      iVar2 = iVar3;
    }
    iVar3 = -0x100;
    if (-0x100 < iVar2) {
      iVar3 = iVar2;
    }
    iVar3 = iVar3 + ctx->next_i_ratio;
    if (iVar3 < 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = max_i_delta_qp[iVar1];
      if (iVar3 < max_i_delta_qp[iVar1]) {
        iVar2 = iVar3;
      }
    }
    ctx->next_i_ratio = iVar2;
    if (((byte)rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","ctx->next_i_ratio %d","calc_next_i_ratio");
    }
  }
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","leave %p\n","calc_next_i_ratio",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET calc_next_i_ratio(RcModelV2Ctx *ctx)
{
    RcCfg *usr_cfg = &ctx->usr_cfg;
    RK_S32 max_i_prop = usr_cfg->max_i_bit_prop * 16;
    RK_S32 gop_len    = usr_cfg->igop;
    RK_S32 pre_qp     = ctx->pre_i_qp;
    RK_S32 bits_alloc;

    rc_dbg_func("enter %p\n", ctx);
    if (gop_len > 1) {
        bits_alloc = ctx->gop_total_bits * max_i_prop / (max_i_prop + 16 * (gop_len - 1));
    } else {
        bits_alloc = ctx->gop_total_bits * max_i_prop / max_i_prop;
    }

    if (ctx->pre_real_bits > bits_alloc || ctx->next_i_ratio) {
        RK_S32 ratio = ((ctx->pre_real_bits - bits_alloc) << 8) / bits_alloc;

        ratio = mpp_clip(ratio, -256, 256);
        ratio = ctx->next_i_ratio + ratio;
        if (ratio >= 0) {
            if (ratio > max_i_delta_qp[pre_qp])
                ratio = max_i_delta_qp[pre_qp];
        } else {
            ratio = 0;
        }
        ctx->next_i_ratio = ratio;
        rc_dbg_rc("ctx->next_i_ratio %d", ctx->next_i_ratio);
    }

    rc_dbg_func("leave %p\n", ctx);
    return MPP_OK;

}